

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

void __thiscall
tonk::ReceiverBandwidthControl::OnProcessedDatagram
          (ReceiverBandwidthControl *this,DatagramInfo *datagram)

{
  bool bVar1;
  uint uVar2;
  BandwidthEstimator *in_RSI;
  long in_RDI;
  uint min_ipg2_usec;
  uint min_trip_usec;
  uint recent_window_usec;
  Counter<unsigned_int,_32U> *in_stack_00000030;
  bool updated;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar3;
  Counter<unsigned_int,_32U> in_stack_ffffffffffffffe4;
  Counter<unsigned_int,_32U> in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  bVar1 = BandwidthEstimator::UpdateOnDatagram
                    (in_RSI,(DatagramInfo *)
                            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8.Value));
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffec);
  Counter<unsigned_int,_32U>::Counter
            ((Counter<unsigned_int,_32U> *)&stack0xffffffffffffffe8,(ThisType *)(in_RDI + 0x2c));
  siamese::
  WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
  ::Update((WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
            *)datagram,in_stack_00000030,_recent_window_usec,_min_ipg2_usec);
  Counter<unsigned_int,_32U>::Counter
            ((Counter<unsigned_int,_32U> *)&stack0xffffffffffffffe4,(ThisType *)(in_RDI + 0x2c));
  siamese::
  WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
  ::Update((WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
            *)datagram,in_stack_00000030,_recent_window_usec,_min_ipg2_usec);
  if ((uVar3 & 0x1000000) != 0) {
    siamese::WindowedMinMax<unsigned_int,_siamese::WindowedMaxCompare<unsigned_int>_>::Update
              ((WindowedMinMax<unsigned_int,_siamese::WindowedMaxCompare<unsigned_int>_> *)in_RSI,
               uVar3,CONCAT44(in_stack_ffffffffffffffe4.Value,in_stack_ffffffffffffffe0),
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    uVar2 = *(uint *)(in_RDI + 0x24) >> 1;
    uVar3 = 30000;
    if (30000 < uVar2) {
      uVar3 = uVar2;
    }
    uVar2 = InterPacketGapEstimator::Get((InterPacketGapEstimator *)(in_RDI + 0x30));
    if (uVar3 < uVar2 << 1) {
      uVar3 = uVar2 << 1;
    }
    *(uint *)(in_RDI + 0xe8) = uVar3;
  }
  return;
}

Assistant:

void ReceiverBandwidthControl::OnProcessedDatagram(const DatagramInfo& datagram)
{
    // Update BW estimate
    const bool updated = Bandwidth.UpdateOnDatagram(datagram);

    // Update minimum OWD
    MinOWD.Update(
        Bandwidth.Measurement.MinReceiveSendDeltaTS24,
        Bandwidth.Measurement.TimestampUsec,
        MinOWD_WindowUsec);

    // Update recent OWD
    RecentOWD.Update(
        Bandwidth.Measurement.MinReceiveSendDeltaTS24,
        Bandwidth.Measurement.TimestampUsec,
        RecentOWD_WindowUsec);

    // If bandwidth estimator has not updated yet:
    if (!updated) {
        return;
    }

    // Update recent max bandwidth
    RecentMaxBW.Update(
        Bandwidth.Measurement.LatestProbeBPS,
        Bandwidth.Measurement.TimestampUsec,
        RecentOWD_WindowUsec);

    // The minimum window must include a few timer ticks
    unsigned recent_window_usec = protocol::kSendTimerTickIntervalUsec * 6;

    // Must wait longer than the minimum OWD / 2
    const unsigned min_trip_usec = Bandwidth.Measurement.SmoothedMinTripUsec / 2;
    if (recent_window_usec < min_trip_usec) {
        recent_window_usec = min_trip_usec;
    }

    // Must wait longer than two (longest) inter-packet gaps
    const unsigned min_ipg2_usec = Bandwidth.InterPacketGap.Get() * 2;
    if (recent_window_usec < min_ipg2_usec) {
        recent_window_usec = min_ipg2_usec;
    }

    // Probe time must be longer than the window to be detected
    RecentOWD_WindowUsec = recent_window_usec;
}